

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O2

Float __thiscall pbrt::PiecewiseConstant2D::PDF(PiecewiseConstant2D *this,Point2f *pr)

{
  PiecewiseConstant1D *pPVar1;
  size_t sVar2;
  size_t sVar3;
  undefined1 auVar4 [16];
  int iVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  undefined1 auVar9 [64];
  undefined1 auVar10 [16];
  undefined1 in_ZMM2 [64];
  undefined1 in_XMM3 [16];
  undefined1 extraout_var [56];
  
  auVar10 = in_ZMM2._0_16_;
  auVar9._0_8_ = Bounds2<float>::Offset(&this->domain,pr);
  auVar9._8_56_ = extraout_var;
  pPVar1 = (this->pConditionalY).ptr;
  sVar2 = (this->pMarginal).func.nStored;
  auVar4 = vmovshdup_avx(auVar9._0_16_);
  sVar3 = (pPVar1->func).nStored;
  auVar10 = vcvtusi2ss_avx512f(auVar10,sVar3);
  uVar6 = sVar3 - 1;
  iVar7 = (int)(auVar9._0_4_ * auVar10._0_4_);
  auVar10 = vcvtusi2ss_avx512f(in_XMM3,sVar2);
  iVar8 = (int)(auVar4._0_4_ * auVar10._0_4_);
  iVar5 = (int)uVar6;
  if ((ulong)(long)iVar7 <= uVar6) {
    iVar5 = iVar7;
  }
  if (iVar7 < 0) {
    iVar5 = 0;
  }
  uVar6 = sVar2 - 1;
  iVar7 = (int)uVar6;
  if ((ulong)(long)iVar8 <= uVar6) {
    iVar7 = iVar8;
  }
  if (iVar8 < 0) {
    iVar7 = 0;
  }
  return pPVar1[iVar7].func.ptr[iVar5] / (this->pMarginal).funcInt;
}

Assistant:

PBRT_CPU_GPU
    Float PDF(const Point2f &pr) const {
        Point2f p = Point2f(domain.Offset(pr));
        int ix =
            Clamp(int(p[0] * pConditionalY[0].size()), 0, pConditionalY[0].size() - 1);
        int iy = Clamp(int(p[1] * pMarginal.size()), 0, pMarginal.size() - 1);
        return pConditionalY[iy].func[ix] / pMarginal.funcInt;
    }